

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O3

State __thiscall PathValidator::validate(PathValidator *this,QString *text,int *param_2)

{
  char cVar1;
  byte bVar2;
  State SVar3;
  QFileInfo pathInfo;
  QFileInfo aQStack_28 [8];
  QDir local_20 [8];
  
  if ((text->d).size == 0) {
    return this->allowEmpty + Intermediate;
  }
  QFileInfo::QFileInfo(aQStack_28,text);
  QFileInfo::dir();
  cVar1 = QDir::exists();
  QDir::~QDir(local_20);
  SVar3 = Invalid;
  if (cVar1 == '\0') goto LAB_00126f3c;
  if (this->mode == ExistingFile) {
    cVar1 = QFileInfo::exists();
    if (cVar1 != '\0') {
      cVar1 = QFileInfo::isFile();
LAB_00126f1a:
      SVar3 = Acceptable;
      if (cVar1 != '\0') goto LAB_00126f3c;
    }
  }
  else {
    if (this->mode != ExistingFolder) {
      bVar2 = QFileInfo::isDir();
      SVar3 = Acceptable - bVar2;
      goto LAB_00126f3c;
    }
    cVar1 = QFileInfo::exists();
    if (cVar1 != '\0') {
      cVar1 = QFileInfo::isDir();
      goto LAB_00126f1a;
    }
  }
  SVar3 = Intermediate;
LAB_00126f3c:
  QFileInfo::~QFileInfo(aQStack_28);
  return SVar3;
}

Assistant:

QValidator::State PathValidator::validate(QString &text, int &) const {
	//check if empty is accepted
	if(text.isEmpty())
		return allowEmpty ? QValidator::Acceptable : QValidator::Intermediate;

	//nonexisting parent dir is not possible
	QFileInfo pathInfo(text);
	if(!pathInfo.dir().exists())
		return QValidator::Invalid;

	switch(mode) {
    case QPathEdit::AnyFile://acceptable, as long as it's not an directoy
      if(pathInfo.isDir())
        return QValidator::Intermediate;
      else
        return QValidator::Acceptable;
    case QPathEdit::ExistingFile://must be an existing file
      if(pathInfo.exists() && pathInfo.isFile())
        return QValidator::Acceptable;
      else
        return QValidator::Intermediate;
    case QPathEdit::ExistingFolder://must be an existing folder
      if(pathInfo.exists() && pathInfo.isDir())
        return QValidator::Acceptable;
      else
        return QValidator::Intermediate;
    default:
      Q_UNREACHABLE();
	}

	return QValidator::Invalid;
}